

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_sit.cpp
# Opt level: O1

int32_t ucol_normalizeShortDefinitionString_63
                  (char *definition,char *destination,int32_t capacity,UParseError *parseError,
                  UErrorCode *status)

{
  byte *__src;
  char cVar1;
  int iVar2;
  size_t sVar3;
  UParseError *parseError_00;
  long lVar4;
  long lVar5;
  UParseError pe;
  CollatorSpec s;
  int local_3d0;
  UParseError local_3c0;
  CollatorSpec local_378;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (destination != (char *)0x0) {
      memset(destination,0,(long)capacity);
    }
    parseError_00 = &local_3c0;
    if (parseError != (UParseError *)0x0) {
      parseError_00 = parseError;
    }
    local_3d0 = 0;
    memset(&local_378,0,0x348);
    local_378.options[0] = UCOL_DEFAULT;
    local_378.options[1] = UCOL_DEFAULT;
    local_378.options[2] = UCOL_DEFAULT;
    local_378.options[3] = UCOL_DEFAULT;
    local_378.options[4] = UCOL_DEFAULT;
    local_378.options[5] = UCOL_DEFAULT;
    local_378.options[6] = UCOL_DEFAULT;
    local_378.options[7] = UCOL_DEFAULT;
    ucol_sit_readSpecs(&local_378,definition,parseError_00,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      lVar4 = 0;
      local_3d0 = 0;
      do {
        __src = (byte *)local_378.entries[lVar4].start;
        if (__src != (byte *)0x0) {
          if (local_3d0 == 0) {
            local_3d0 = 0;
          }
          else {
            if (local_3d0 < capacity) {
              sVar3 = strlen(destination);
              (destination + sVar3)[0] = '_';
              (destination + sVar3)[1] = '\0';
            }
            local_3d0 = local_3d0 + 1;
          }
          if ((*__src - 0x4b < 0xc) && ((0x883U >> (*__src - 0x4b & 0x1f) & 1) != 0)) {
            iVar2 = local_378.entries[lVar4].len;
            if (0 < iVar2) {
              lVar5 = 0;
              do {
                if (local_3d0 + lVar5 < (long)capacity) {
                  cVar1 = uprv_toupper_63(local_378.entries[lVar4].start[lVar5]);
                  destination[lVar5 + local_3d0] = cVar1;
                }
                lVar5 = lVar5 + 1;
                iVar2 = local_378.entries[lVar4].len;
              } while (lVar5 < iVar2);
            }
            local_3d0 = local_3d0 + iVar2;
          }
          else {
            iVar2 = local_378.entries[lVar4].len;
            local_3d0 = local_3d0 + iVar2;
            if (local_3d0 < capacity) {
              strncat(destination,(char *)__src,(long)iVar2);
            }
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x11);
    }
    return local_3d0;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_normalizeShortDefinitionString(const char *definition,
                                    char *destination,
                                    int32_t capacity,
                                    UParseError *parseError,
                                    UErrorCode *status)
{

    if(U_FAILURE(*status)) {
        return 0;
    }

    if(destination) {
        uprv_memset(destination, 0, capacity*sizeof(char));
    }

    UParseError pe;
    if(!parseError) {
        parseError = &pe;
    }

    // validate
    CollatorSpec s;
    ucol_sit_initCollatorSpecs(&s);
    ucol_sit_readSpecs(&s, definition, parseError, status);
    return ucol_sit_dumpSpecs(&s, destination, capacity, status);
}